

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getAndInitPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,BtCursor *pCur,int bReadOnly)

{
  MemPage *pMVar1;
  char cVar2;
  int iVar3;
  DbPage *pDbPage;
  DbPage *local_30;
  
  if (pBt->nPage < pgno) {
    iVar3 = sqlite3CorruptError(0x112ce);
    goto LAB_0017253a;
  }
  iVar3 = (*pBt->pPager->xGet)(pBt->pPager,pgno,&local_30,bReadOnly);
  if (iVar3 != 0) goto LAB_0017253a;
  pMVar1 = (MemPage *)local_30->pExtra;
  *ppPage = pMVar1;
  if (pMVar1->isInit == '\0') {
    btreePageFromDbPage(local_30,pgno,pBt);
    iVar3 = btreeInitPage(*ppPage);
    if (iVar3 == 0) goto LAB_001724f2;
  }
  else {
LAB_001724f2:
    if (pCur == (BtCursor *)0x0) {
      return 0;
    }
    if (((*ppPage)->nCell != 0) && ((*ppPage)->intKey == pCur->curIntKey)) {
      return 0;
    }
    iVar3 = sqlite3CorruptError(0x112e3);
  }
  releasePage(*ppPage);
LAB_0017253a:
  if (pCur != (BtCursor *)0x0) {
    cVar2 = pCur->iPage + -1;
    pCur->iPage = cVar2;
    pCur->pPage = pCur->apPage[cVar2];
  }
  return iVar3;
}

Assistant:

static int getAndInitPage(
  BtShared *pBt,                  /* The database file */
  Pgno pgno,                      /* Number of the page to get */
  MemPage **ppPage,               /* Write the page pointer here */
  BtCursor *pCur,                 /* Cursor to receive the page, or NULL */
  int bReadOnly                   /* True for a read-only page */
){
  int rc;
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pCur==0 || ppPage==&pCur->pPage );
  assert( pCur==0 || bReadOnly==pCur->curPagerFlags );
  assert( pCur==0 || pCur->iPage>0 );

  if( pgno>btreePagecount(pBt) ){
    rc = SQLITE_CORRUPT_BKPT;
    goto getAndInitPage_error1;
  }
  rc = sqlite3PagerGet(pBt->pPager, pgno, (DbPage**)&pDbPage, bReadOnly);
  if( rc ){
    goto getAndInitPage_error1;
  }
  *ppPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( (*ppPage)->isInit==0 ){
    btreePageFromDbPage(pDbPage, pgno, pBt);
    rc = btreeInitPage(*ppPage);
    if( rc!=SQLITE_OK ){
      goto getAndInitPage_error2;
    }
  }
  assert( (*ppPage)->pgno==pgno || CORRUPT_DB );
  assert( (*ppPage)->aData==sqlite3PagerGetData(pDbPage) );

  /* If obtaining a child page for a cursor, we must verify that the page is
  ** compatible with the root page. */
  if( pCur && ((*ppPage)->nCell<1 || (*ppPage)->intKey!=pCur->curIntKey) ){
    rc = SQLITE_CORRUPT_PGNO(pgno);
    goto getAndInitPage_error2;
  }
  return SQLITE_OK;

getAndInitPage_error2:
  releasePage(*ppPage);
getAndInitPage_error1:
  if( pCur ){
    pCur->iPage--;
    pCur->pPage = pCur->apPage[pCur->iPage];
  }
  testcase( pgno==0 );
  assert( pgno!=0 || rc!=SQLITE_OK );
  return rc;
}